

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intUtil.c
# Opt level: O0

int Inter_ManCheckAllStates(Aig_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  abctime aVar3;
  abctime clk;
  int status;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Aig_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  iVar1 = Saig_ManRegNum(p);
  p_00 = Cnf_Derive(p,iVar1);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  Cnf_DataFree(p_00);
  if (s == (sat_solver *)0x0) {
    p_local._4_4_ = 1;
  }
  else {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    sat_solver_delete(s);
    Abc_Print(1,"%s =","Time");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar2) * 1.0) / 1000000.0);
    p_local._4_4_ = (uint)(iVar1 == -1);
  }
  return p_local._4_4_;
}

Assistant:

int Inter_ManCheckAllStates( Aig_Man_t * p )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int status;
    abctime clk = Abc_Clock();
    pCnf = Cnf_Derive( p, Saig_ManRegNum(p) ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Cnf_DataFree( pCnf );
    if ( pSat == NULL )
        return 1;
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    sat_solver_delete( pSat );
    ABC_PRT( "Time", Abc_Clock() - clk );
    return status == l_False;
}